

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

float rsg::DeclarationStatement::getWeight(GeneratorState *state)

{
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar1;
  Statement *pSVar2;
  long lVar3;
  pointer ppVVar4;
  
  pvVar1 = VariableManager::getLiveVariables(state->m_varManager);
  ppVVar4 = (pvVar1->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVVar4 ==
        (pvVar1->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      return 0.0;
    }
    if ((*ppVVar4)->m_storage == STORAGE_LOCAL) break;
    ppVVar4 = ppVVar4 + 1;
  }
  pSVar2 = GeneratorState::getStatementStackEntry
                     (state,(int)((ulong)((long)(state->m_statementStack->
                                                super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(state->m_statementStack->
                                               super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 3) +
                            -1);
  if (pSVar2 != (Statement *)0x0) {
    lVar3 = __dynamic_cast(pSVar2,&Statement::typeinfo,&BlockStatement::typeinfo,0);
    if (lVar3 == 0) {
      return 0.0;
    }
    return (float)(int)state->m_programParams->declarationStatementBaseWeight;
  }
  return 0.0;
}

Assistant:

float DeclarationStatement::getWeight (const GeneratorState& state)
{
	if (!hasDeclarableVars(state.getVariableManager()))
		return 0.0f;

	if (!isCurrentTopStatementBlock(state))
		return 0.0f;

	return state.getProgramParameters().declarationStatementBaseWeight;
}